

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O3

void __thiscall iDynTree::KinDynComputations::computeBiasAccFwdKinematics(KinDynComputations *this)

{
  KinDynComputationsPrivateAttributes *pKVar1;
  bool bVar2;
  Twist *bodyFixedVel;
  Rotation *inertial_R_body;
  Transform *this_00;
  Vector6 zeroBaseAcc;
  Vector6 local_118;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  Transform local_b8 [48];
  SpatialAcc local_88 [2];
  
  pKVar1 = this->pimpl;
  if (pKVar1->m_areBiasAccelerationsUpdated != false) {
    return;
  }
  local_118.m_data[4] = 0.0;
  local_118.m_data[5] = 0.0;
  local_118.m_data[2] = 0.0;
  local_118.m_data[3] = 0.0;
  local_118.m_data[0] = 0.0;
  local_118.m_data[1] = 0.0;
  if (pKVar1->m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION) {
    iDynTree::FreeFloatingPos::worldBasePos();
    local_d8 = 0;
    local_e8 = 0;
    uStack_e0 = 0;
    local_d0 = 0;
    uStack_c8 = 0;
    local_c0 = 0;
    iDynTree::Transform::inverse();
    this_00 = local_b8;
    iDynTree::Transform::operator*(this_00,local_88);
    pKVar1 = this->pimpl;
  }
  else {
    if (pKVar1->m_frameVelRepr == BODY_FIXED_REPRESENTATION) {
      (pKVar1->m_baseBiasAcc).super_SpatialMotionVector.
      super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[0] = 0.0;
      (pKVar1->m_baseBiasAcc).super_SpatialMotionVector.
      super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[1] = 0.0;
      (pKVar1->m_baseBiasAcc).super_SpatialMotionVector.
      super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[2] = 0.0;
      (pKVar1->m_baseBiasAcc).super_SpatialMotionVector.
      super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[0] = 0.0;
      (pKVar1->m_baseBiasAcc).super_SpatialMotionVector.
      super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[1] = 0.0;
      (pKVar1->m_baseBiasAcc).super_SpatialMotionVector.
      super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[2] = 0.0;
      goto LAB_0010b956;
    }
    bodyFixedVel = (Twist *)iDynTree::FreeFloatingVel::baseVel();
    iDynTree::FreeFloatingPos::worldBasePos();
    inertial_R_body = (Rotation *)iDynTree::Transform::getRotation();
    this_00 = (Transform *)local_88;
    convertMixedAccelerationToBodyFixedAcceleration(&local_118,bodyFixedVel,inertial_R_body);
    pKVar1 = this->pimpl;
  }
  iDynTree::SpatialAcc::operator=(&pKVar1->m_baseBiasAcc,(SpatialAcc *)this_00);
LAB_0010b956:
  pKVar1 = this->pimpl;
  bVar2 = (bool)iDynTree::ForwardBiasAccKinematics
                          (&pKVar1->m_robot_model,&pKVar1->m_traversal,&pKVar1->m_pos,&pKVar1->m_vel
                           ,&pKVar1->m_baseBiasAcc,&pKVar1->m_linkVel,&pKVar1->m_linkBiasAcc);
  iDynTree::reportErrorIf
            ((bool)(bVar2 ^ 1),"KinDynComputations::computeBiasAccFwdKinematics",
             "Error in computing the bias accelerations.");
  this->pimpl->m_areBiasAccelerationsUpdated = bVar2;
  return;
}

Assistant:

void KinDynComputations::computeBiasAccFwdKinematics()
{
    if( this->pimpl->m_areBiasAccelerationsUpdated )
    {
        return;
    }

    // Convert input base acceleration, that in this case is zero
    Vector6 zeroBaseAcc;
    zeroBaseAcc.zero();
    if( pimpl->m_frameVelRepr == BODY_FIXED_REPRESENTATION )
    {
        fromEigen(pimpl->m_baseBiasAcc,toEigen(zeroBaseAcc));
    }
    else if( pimpl->m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION )
    {
        pimpl->m_baseBiasAcc = convertInertialAccelerationToBodyFixedAcceleration(zeroBaseAcc, pimpl->m_pos.worldBasePos());
    }
    else
    {
        assert(pimpl->m_frameVelRepr == MIXED_REPRESENTATION);
        pimpl->m_baseBiasAcc = convertMixedAccelerationToBodyFixedAcceleration(zeroBaseAcc,
                                                                               pimpl->m_vel.baseVel(),
                                                                               pimpl->m_pos.worldBasePos().getRotation());
    }

    // Compute body-fixed bias accelerations
    bool ok = ForwardBiasAccKinematics(pimpl->m_robot_model,
                                       pimpl->m_traversal,
                                       pimpl->m_pos,
                                       pimpl->m_vel,
                                       pimpl->m_baseBiasAcc,
                                       pimpl->m_linkVel,
                                       pimpl->m_linkBiasAcc);

    reportErrorIf(!ok,"KinDynComputations::computeBiasAccFwdKinematics","Error in computing the bias accelerations.");

    this->pimpl->m_areBiasAccelerationsUpdated = ok;
}